

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

state * __thiscall parser::state::operator++(state *this)

{
  ind *piVar1;
  ind iVar2;
  _Map_pointer ppcVar3;
  _Map_pointer ppuVar4;
  _Map_pointer ppuVar5;
  _Elt_pointer puVar6;
  _Elt_pointer pcVar7;
  ssize_t sVar8;
  _Elt_pointer pcVar9;
  void *__buf;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  
  iVar2 = (this->pos).i;
  pcVar9 = (_Elt_pointer)(iVar2 - (this->off).i);
  ppcVar3 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  pcVar7 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
           ._M_start._M_last +
           (long)((this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppcVar3 -
                             (long)(this->str).super__Deque_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) -
                 (long)(this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur));
  if (pcVar7 <= pcVar9) {
    return this;
  }
  __buf = (void *)(iVar2 + 1);
  (this->pos).i = (ind)__buf;
  pcVar9 = pcVar9 + 1;
  if ((pcVar9 == pcVar7) &&
     (sVar8 = read(this,(int)ppcVar3,__buf,(size_t)pcVar9), (char)sVar8 == '\0')) goto LAB_0012fced;
  iVar2 = (this->pos).ln;
  lVar10 = iVar2 - (this->off).ln;
  ppuVar4 = (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppuVar5 = (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar6 = (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if (lVar10 == ((long)(this->lines).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur -
                 (long)(this->lines).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_first >> 3) +
                ((((ulong)((long)ppuVar4 - (long)ppuVar5) >> 3) - 1) +
                (ulong)(ppuVar4 == (_Map_pointer)0x0)) * 0x40 +
                ((long)(this->lines).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_start._M_last - (long)puVar6 >> 3) + -1)
  goto LAB_0012fced;
  lVar10 = lVar10 + 1;
  uVar12 = ((long)puVar6 -
            (long)(this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + lVar10;
  if ((long)uVar12 < 0) {
    uVar11 = (long)uVar12 >> 6;
LAB_0012fcd6:
    puVar13 = ppuVar5[uVar11] + uVar12 + uVar11 * -0x40;
  }
  else {
    if (0x3f < uVar12) {
      uVar11 = uVar12 >> 6;
      goto LAB_0012fcd6;
    }
    puVar13 = puVar6 + lVar10;
  }
  if (*puVar13 <= (this->pos).i) {
    (this->pos).ln = iVar2 + 1;
    (this->pos).cl = 0;
    return this;
  }
LAB_0012fced:
  piVar1 = &(this->pos).cl;
  *piVar1 = *piVar1 + 1;
  return this;
}

Assistant:

state& operator ++ () {
			ind i = pos.i - off.i;
			
			// ignore if already end of stream
			if ( i >= str.size() ) return *this;
			
			// update index
			++pos.i;
			
			// read more input if neccessary, terminating on end-of-stream
			if ( ++i == str.size() && !read() ) { ++pos.cl; return *this; }
			
			// update row and column
			ind j = pos.ln - off.ln;
			if ( j == lines.size() - 1 || pos.i < lines[j+1] ) {
				++pos.cl;
			} else {
				++pos.ln;
				pos.cl = 0;
			}
			
			return *this;
		}